

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O1

drwav_uint64 drwav_read_f32(drwav *pWav,drwav_uint64 samplesToRead,float *pBufferOut)

{
  drwav_uint64 dVar1;
  drwav_uint64 dVar2;
  drwav_uint64 dVar3;
  drwav_int16 adStack_1038 [2052];
  
  if (pBufferOut != (float *)0x0 && (samplesToRead != 0 && pWav != (drwav *)0x0)) {
    switch(pWav->translatedFormatTag) {
    case 1:
      dVar3 = drwav_read_f32__pcm(pWav,samplesToRead,pBufferOut);
      return dVar3;
    case 2:
      dVar3 = drwav_read_f32__msadpcm(pWav,samplesToRead,pBufferOut);
      return dVar3;
    case 3:
      dVar3 = drwav_read_f32__ieee(pWav,samplesToRead,pBufferOut);
      return dVar3;
    case 4:
    case 5:
      break;
    case 6:
      dVar3 = drwav_read_f32__alaw(pWav,samplesToRead,pBufferOut);
      return dVar3;
    case 7:
      dVar3 = drwav_read_f32__mulaw(pWav,samplesToRead,pBufferOut);
      return dVar3;
    default:
      if (pWav->translatedFormatTag == 0x11) {
        dVar3 = 0;
        do {
          if (samplesToRead == 0) {
            return dVar3;
          }
          dVar1 = 0x800;
          if (samplesToRead < 0x800) {
            dVar1 = samplesToRead;
          }
          dVar1 = drwav_read_s16(pWav,dVar1,adStack_1038);
          if (dVar1 != 0) {
            if (pBufferOut != (float *)0x0) {
              dVar2 = 0;
              do {
                pBufferOut[dVar2] = (float)(int)adStack_1038[dVar2] * 3.0517578e-05;
                dVar2 = dVar2 + 1;
              } while (dVar1 != dVar2);
            }
            pBufferOut = pBufferOut + dVar1;
            samplesToRead = samplesToRead - dVar1;
            dVar3 = dVar3 + dVar1;
          }
        } while (dVar1 != 0);
        return dVar3;
      }
    }
  }
  return 0;
}

Assistant:

drwav_uint64 drwav_read_f32(drwav* pWav, drwav_uint64 samplesToRead, float* pBufferOut)
{
    if (pWav == NULL || samplesToRead == 0 || pBufferOut == NULL) {
        return 0;
    }

    // Don't try to read more samples than can potentially fit in the output buffer.
    if (samplesToRead * sizeof(float) > DRWAV_SIZE_MAX) {
        samplesToRead = DRWAV_SIZE_MAX / sizeof(float);
    }

    if (pWav->translatedFormatTag == DR_WAVE_FORMAT_PCM) {
        return drwav_read_f32__pcm(pWav, samplesToRead, pBufferOut);
    }

    if (pWav->translatedFormatTag == DR_WAVE_FORMAT_ADPCM) {
        return drwav_read_f32__msadpcm(pWav, samplesToRead, pBufferOut);
    }

    if (pWav->translatedFormatTag == DR_WAVE_FORMAT_IEEE_FLOAT) {
        return drwav_read_f32__ieee(pWav, samplesToRead, pBufferOut);
    }

    if (pWav->translatedFormatTag == DR_WAVE_FORMAT_ALAW) {
        return drwav_read_f32__alaw(pWav, samplesToRead, pBufferOut);
    }

    if (pWav->translatedFormatTag == DR_WAVE_FORMAT_MULAW) {
        return drwav_read_f32__mulaw(pWav, samplesToRead, pBufferOut);
    }

    if (pWav->translatedFormatTag == DR_WAVE_FORMAT_DVI_ADPCM) {
        return drwav_read_f32__ima(pWav, samplesToRead, pBufferOut);
    }

    return 0;
}